

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArithmeticSubtermGeneralization.cpp
# Opt level: O2

Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> * __thiscall
Inferences::intersectSortedStack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>>
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>
           *__return_storage_ptr__,Inferences *this,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *l,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *r)

{
  bool bVar1;
  uint uVar2;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *this_00;
  uint uVar3;
  char *__file;
  long lVar4;
  ulong uVar5;
  long lVar6;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *l_00;
  
  lVar4 = *(long *)(this + 8);
  lVar6 = *(long *)(this + 0x10);
  this_00 = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)this;
  if ((lVar6 != lVar4) && (this_00 = l, l->_cursor != l->_stack)) {
    this_00 = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)this;
    if ((ulong)((long)l->_cursor - (long)l->_stack) < (ulong)(lVar6 - lVar4)) {
      this_00 = l;
    }
    uVar3 = 0;
    uVar2 = 0;
    uVar5 = 0;
    while( true ) {
      __file = (char *)(ulong)uVar3;
      if ((ulong)(lVar6 - lVar4 >> 5) <= (ulong)uVar2) break;
      if ((ulong)((long)l->_cursor - (long)l->_stack >> 5) <= uVar5) break;
      lVar6 = (ulong)uVar2 * 0x20;
      bVar1 = Kernel::operator==((Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                                 (lVar4 + lVar6),l->_stack + uVar5);
      l_00 = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)(lVar6 + *(long *)(this + 8))
      ;
      if (bVar1) {
        uVar3 = uVar3 + 1;
        Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::operator=
                  (this_00->_stack + (long)__file,l_00);
        uVar2 = uVar2 + 1;
        uVar5 = (ulong)((int)uVar5 + 1);
      }
      else {
        bVar1 = Kernel::operator<(l_00,l->_stack + uVar5);
        if (bVar1) {
          uVar2 = uVar2 + 1;
        }
        else {
          uVar5 = (ulong)((int)uVar5 + 1);
        }
      }
      lVar4 = *(long *)(this + 8);
      lVar6 = *(long *)(this + 0x10);
    }
    Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::truncate
              (this_00,__file,(__off_t)l);
  }
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::Stack
            (__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

Stack<C> intersectSortedStack(Stack<C>&& l, Stack<C>&& r) 
{
  // DEBUG("lhs: ", l)
  // DEBUG("rhs: ", r)

  if (l.size() == 0) return std::move(l);
  if (r.size() == 0) return std::move(r);

  unsigned outOffs = 0;
  auto& out = l.size() <= r.size() ? l : r;
  unsigned loffs = 0;
  unsigned roffs = 0;
  while (loffs < l.size() && roffs < r.size()) {
    if (l[loffs] == r[roffs]) {
      out[outOffs++] = l[loffs];
      loffs++;
      roffs++;
    } else if(l[loffs] < r[roffs]) {
      loffs++;
    } else {
      roffs++;
    }
  }
  
  out.truncate(outOffs);
  //DEBUG("out: ", out);
  return std::move(out);
}